

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::optional<slang::ast::SequenceRepetition>&,bool>
          (BumpAllocator *this,Expression *args,optional<slang::ast::SequenceRepetition> *args_1,
          bool *args_2)

{
  optional<slang::ast::SequenceRepetition> repetition;
  SimpleAssertionExpr *this_00;
  undefined4 in_ECX;
  long in_RDX;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffdc;
  
  this_00 = (SimpleAssertionExpr *)
            allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._12_4_ =
       in_stack_ffffffffffffffdc;
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._0_12_ =
       *(undefined1 (*) [12])(in_RDX + 8);
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._16_4_ = in_ECX;
  ast::SimpleAssertionExpr::SimpleAssertionExpr
            (this_00,(Expression *)
                     CONCAT44(in_stack_ffffffffffffffbc,*(undefined4 *)(in_RDX + 0x10)),repetition,
             SUB81((ulong)*(undefined8 *)*(undefined1 (*) [12])(in_RDX + 8) >> 0x38,0));
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }